

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O0

void Hacl_Bignum25519_fmul(uint64_t *out,uint64_t *a,uint64_t *b)

{
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  
  Hacl_Bignum_fmul(in_RSI,in_RDX,(uint64_t *)0x10ef95);
  return;
}

Assistant:

static void Hacl_Bignum25519_fmul(uint64_t *out, uint64_t *a, uint64_t *b)
{
  Hacl_Bignum_fmul(out, a, b);
}